

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.c
# Opt level: O3

int32_t wal_get_type(uchar *buffer)

{
  uchar uVar1;
  int32_t iVar2;
  long lVar3;
  
  uVar1 = *buffer;
  if (uVar1 == '\x03') {
    lVar3 = 0;
    do {
      if (buffer[lVar3 + 4] != '\0' && 0x5e < (byte)(buffer[lVar3 + 4] - 0x20)) {
        return 0;
      }
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 0x20);
    lVar3 = 0;
    do {
      if (buffer[lVar3 + 0x50] != '\0' && 0x5e < (byte)(buffer[lVar3 + 0x50] - 0x20)) {
        return 0;
      }
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 0x20);
    iVar2 = 2;
  }
  else {
    iVar2 = 0;
    if (uVar1 == '\0' || (byte)(uVar1 - 0x20) < 0x5f) {
      lVar3 = 0;
      do {
        if (buffer[lVar3] != '\0' && 0x5e < (byte)(buffer[lVar3] - 0x20)) {
          return 0;
        }
        lVar3 = lVar3 + 1;
      } while ((int)lVar3 != 0x20);
      iVar2 = 0;
      lVar3 = 0;
      while (buffer[lVar3 + 0x38] == '\0' || (byte)(buffer[lVar3 + 0x38] - 0x20) < 0x5f) {
        lVar3 = lVar3 + 1;
        if ((int)lVar3 == 0x20) {
          return 1;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int32_t wal_get_type(const unsigned char *buffer)
{
	uint8_t version = (uint8_t)(*buffer);
	if (version == 3) {
		goto possibly_daikatana;
	} else if (is_printable(version) || (version == 0)) {
		goto possibly_quake2;
	}
	goto not_a_wal;

possibly_daikatana:
	if (invalid_name(buffer + offsetof(struct wal_dk_header, name), 0) ||
		invalid_name(buffer + offsetof(struct wal_dk_header, animname), 0)) {
		goto not_a_wal;
	}
	return WAL_TYPE_DAIKATANA;
possibly_quake2:
	if (invalid_name(buffer + offsetof(struct wal_q2_header, name), 0) ||
		invalid_name(buffer + offsetof(struct wal_q2_header, animname), 0)) {
		goto not_a_wal;
	}
	return WAL_TYPE_QUAKE2;
not_a_wal:
	return WAL_NOT_A_WAL;
}